

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

void __thiscall sf::Font::Font(Font *this,Font *copy)

{
  pointer pcVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  void *pvVar6;
  
  pvVar6 = copy->m_face;
  this->m_library = copy->m_library;
  this->m_face = pvVar6;
  uVar3 = *(undefined4 *)((long)&copy->m_streamRec + 4);
  uVar4 = *(undefined4 *)&copy->m_stroker;
  uVar5 = *(undefined4 *)((long)&copy->m_stroker + 4);
  *(undefined4 *)&this->m_streamRec = *(undefined4 *)&copy->m_streamRec;
  *(undefined4 *)((long)&this->m_streamRec + 4) = uVar3;
  *(undefined4 *)&this->m_stroker = uVar4;
  *(undefined4 *)((long)&this->m_stroker + 4) = uVar5;
  this->m_refCount = copy->m_refCount;
  this->m_isSmooth = copy->m_isSmooth;
  (this->m_info).family._M_dataplus._M_p = (pointer)&(this->m_info).family.field_2;
  pcVar1 = (copy->m_info).family._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_info,pcVar1,pcVar1 + (copy->m_info).family._M_string_length);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sf::Font::Page>,_std::_Select1st<std::pair<const_unsigned_int,_sf::Font::Page>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sf::Font::Page>_>_>
  ::_Rb_tree(&(this->m_pages)._M_t,&(copy->m_pages)._M_t);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_pixelBuffer,&copy->m_pixelBuffer);
  piVar2 = this->m_refCount;
  if (piVar2 != (int *)0x0) {
    *piVar2 = *piVar2 + 1;
  }
  return;
}

Assistant:

Font::Font(const Font& copy) :
m_library    (copy.m_library),
m_face       (copy.m_face),
m_streamRec  (copy.m_streamRec),
m_stroker    (copy.m_stroker),
m_refCount   (copy.m_refCount),
m_isSmooth   (copy.m_isSmooth),
m_info       (copy.m_info),
m_pages      (copy.m_pages),
m_pixelBuffer(copy.m_pixelBuffer)
{
    #ifdef SFML_SYSTEM_ANDROID
        m_stream = NULL;
    #endif

    // Note: as FreeType doesn't provide functions for copying/cloning,
    // we must share all the FreeType pointers

    if (m_refCount)
        (*m_refCount)++;
}